

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

nullres nullcSetFunction(char *name,NULLCFuncPtr func)

{
  nullres nVar1;
  uint index;
  ExternFuncInfo *pEVar2;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  else {
    index = nullcFindFunctionIndex(name);
    if (index != 0xffffffff) {
      pEVar2 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                         ((FastVector<ExternFuncInfo,_false,_false> *)(NULLC::linker + 0x240),
                          func.id);
      if (pEVar2->funcCat == '\0') {
        pEVar2 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                           ((FastVector<ExternFuncInfo,_false,_false> *)(NULLC::linker + 0x240),
                            index);
        if (pEVar2->builtinIndex == 0) {
          nVar1 = nullcRedirectFunction(index,func.id);
          return nVar1;
        }
        NULLC::nullcLastError = "ERROR: can\'t override builtin function";
      }
      else {
        NULLC::nullcLastError = "ERROR: source function uses context, which is unavailable";
      }
    }
  }
  return '\0';
}

Assistant:

nullres nullcSetFunction(const char* name, NULLCFuncPtr func)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	unsigned index = nullcFindFunctionIndex(name);
	if(index == ~0u)
		return false;

	if(linker->exFunctions[func.id].funcCat != ExternFuncInfo::NORMAL)
	{
		nullcLastError = "ERROR: source function uses context, which is unavailable";
		return false;
	}

	if(linker->exFunctions[index].builtinIndex != 0)
	{
		nullcLastError = "ERROR: can't override builtin function";
		return false;
	}

	return nullcRedirectFunction(index, func.id);
}